

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

HTTPAPI_RESULT HTTPAPI_CloneOption(char *optionName,void *value,void **savedValue)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined4 *puVar3;
  char *pcVar4;
  int *piVar5;
  undefined8 *puVar6;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar7;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  long *temp_2;
  LOGGER_LOG l_8;
  HTTP_PROXY_OPTIONS *new_proxy_info;
  HTTP_PROXY_OPTIONS *proxy_data;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  OPTION_OPENSSL_KEY_TYPE *temp_1;
  OPTION_OPENSSL_KEY_TYPE type;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  uint *temp;
  LOGGER_LOG l;
  HTTPAPI_RESULT result;
  void **savedValue_local;
  void *value_local;
  char *optionName_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (((optionName == (char *)0x0) || (value == (void *)0x0)) || (savedValue == (void **)0x0)) {
    l._4_4_ = HTTPAPI_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_CloneOption",0x487,1,
                "invalid argument(NULL) passed to HTTPAPI_CloneOption");
    }
  }
  else {
    iVar1 = strcmp("timeout",optionName);
    if (iVar1 == 0) {
      puVar3 = (undefined4 *)malloc(4);
      if (puVar3 == (undefined4 *)0x0) {
        l._4_4_ = HTTPAPI_ERROR;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_ERROR);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                    ,"HTTPAPI_CloneOption",0x492,1,"malloc failed (result = %s%s (%d))","",pcVar4,3)
          ;
        }
      }
      else {
        *puVar3 = *value;
        *savedValue = puVar3;
        l._4_4_ = HTTPAPI_OK;
      }
    }
    else {
      iVar1 = strcmp("x509certificate",optionName);
      if ((iVar1 == 0) || (iVar1 = strcmp("x509EccCertificate",optionName), iVar1 == 0)) {
        iVar1 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
        if (iVar1 == 0) {
          l._4_4_ = HTTPAPI_OK;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                      ,"HTTPAPI_CloneOption",0x4a0,1,"unable to clone the x509 certificate content")
            ;
          }
          l._4_4_ = HTTPAPI_ERROR;
        }
      }
      else {
        iVar1 = strcmp("x509PrivatekeyType",optionName);
        if (iVar1 == 0) {
          iVar1 = *value;
          if ((iVar1 == 0) || (iVar1 == 1)) {
            piVar5 = (int *)malloc(4);
            if (piVar5 == (int *)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                          ,"HTTPAPI_CloneOption",0x4b2,1,"unable to clone x509PrivatekeyType");
              }
              l._4_4_ = HTTPAPI_ERROR;
            }
            else {
              *piVar5 = iVar1;
              *savedValue = piVar5;
              l._4_4_ = HTTPAPI_OK;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                        ,"HTTPAPI_CloneOption",0x4be,1,"Unknown x509PrivatekeyType: %i",
                        CONCAT44(uVar7,iVar1));
            }
            l._4_4_ = HTTPAPI_ERROR;
          }
        }
        else {
          iVar1 = strcmp("Engine",optionName);
          if (iVar1 == 0) {
            iVar1 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
            if (iVar1 == 0) {
              l._4_4_ = HTTPAPI_OK;
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                          ,"HTTPAPI_CloneOption",0x4c7,1,"unable to clone %s",optionName);
              }
              l._4_4_ = HTTPAPI_ERROR;
            }
          }
          else {
            iVar1 = strcmp("x509privatekey",optionName);
            if ((iVar1 == 0) || (iVar1 = strcmp("x509EccAliasKey",optionName), iVar1 == 0)) {
              iVar1 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
              if (iVar1 == 0) {
                l._4_4_ = HTTPAPI_OK;
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                            ,"HTTPAPI_CloneOption",0x4d6,1,
                            "unable to clone the x509 private key content");
                }
                l._4_4_ = HTTPAPI_ERROR;
              }
            }
            else {
              iVar1 = strcmp("TrustedCerts",optionName);
              if (iVar1 == 0) {
                iVar1 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
                if (iVar1 == 0) {
                  l._4_4_ = HTTPAPI_OK;
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                              ,"HTTPAPI_CloneOption",0x4e3,1,"unable to clone TrustedCerts");
                  }
                  l._4_4_ = HTTPAPI_ERROR;
                }
              }
              else {
                iVar1 = strcmp("proxy_data",optionName);
                if (iVar1 == 0) {
                  puVar6 = (undefined8 *)malloc(0x20);
                  if (puVar6 == (undefined8 *)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                                ,"HTTPAPI_CloneOption",0x4f3,1,
                                "unable to allocate proxy option information");
                    }
                    l._4_4_ = HTTPAPI_ERROR;
                  }
                  else {
                    *puVar6 = *value;
                    *(undefined4 *)(puVar6 + 1) = *(undefined4 *)((long)value + 8);
                    puVar6[3] = *(undefined8 *)((long)value + 0x18);
                    puVar6[2] = *(undefined8 *)((long)value + 0x10);
                    *savedValue = puVar6;
                    l._4_4_ = HTTPAPI_OK;
                  }
                }
                else {
                  iVar1 = strcmp("CURLOPT_LOW_SPEED_LIMIT",optionName);
                  if ((((iVar1 == 0) ||
                       (iVar1 = strcmp("CURLOPT_LOW_SPEED_TIME",optionName), iVar1 == 0)) ||
                      (iVar1 = strcmp("CURLOPT_FRESH_CONNECT",optionName), iVar1 == 0)) ||
                     ((iVar1 = strcmp("CURLOPT_FORBID_REUSE",optionName), iVar1 == 0 ||
                      (iVar1 = strcmp("CURLOPT_VERBOSE",optionName), iVar1 == 0)))) {
                    puVar6 = (undefined8 *)malloc(8);
                    if (puVar6 == (undefined8 *)0x0) {
                      l._4_4_ = HTTPAPI_ERROR;
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_ERROR);
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_CloneOption",0x50e,1,
                                  "malloc failed (result = %s%s (%d))","",pcVar4,3);
                      }
                    }
                    else {
                      *puVar6 = *value;
                      *savedValue = puVar6;
                      l._4_4_ = HTTPAPI_OK;
                    }
                  }
                  else {
                    iVar1 = strcmp("CURLOPT_INTERFACE",optionName);
                    if (iVar1 == 0) {
                      iVar1 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
                      if (iVar1 == 0) {
                        l._4_4_ = HTTPAPI_OK;
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                                    ,"HTTPAPI_CloneOption",0x51b,1,
                                    "unable to clone the interface name");
                        }
                        l._4_4_ = HTTPAPI_ERROR;
                      }
                    }
                    else {
                      l._4_4_ = HTTPAPI_INVALID_ARG;
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_CloneOption",0x527,1,"unknown option %s",optionName);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_CloneOption(const char* optionName, const void* value, const void** savedValue)
{
    HTTPAPI_RESULT result;
    if (
        (optionName == NULL) ||
        (value == NULL) ||
        (savedValue == NULL)
        )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("invalid argument(NULL) passed to HTTPAPI_CloneOption");
    }
    else
    {
        if (strcmp(OPTION_HTTP_TIMEOUT, optionName) == 0)
        {
            /*by convention value is pointing to an unsigned int */
            unsigned int* temp = malloc(sizeof(unsigned int)); /*shall be freed by HTTPAPIEX*/
            if (temp == NULL)
            {
                result = HTTPAPI_ERROR;
                LogError("malloc failed (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                *temp = *(const unsigned int*)value;
                *savedValue = temp;
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            /*this is getting the x509 certificate. In this case, value is a pointer to a const char* that contains the certificate as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the x509 certificate content");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the certificate has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
#ifdef USE_OPENSSL
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            if (type == KEY_TYPE_DEFAULT || type == KEY_TYPE_ENGINE)
            {
                OPTION_OPENSSL_KEY_TYPE* temp = malloc(sizeof(OPTION_OPENSSL_KEY_TYPE));
                if (temp == NULL)
                {
                    LogError("unable to clone x509PrivatekeyType");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    *temp = type;
                    *savedValue = temp;
                    result = HTTPAPI_OK;
                }
            }
            else
            {
                LogError("Unknown x509PrivatekeyType: %i", type);
                result = HTTPAPI_ERROR;
            }
        }
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            /*this is getting the engine. In this case, value is a pointer to a const char* that contains the engine as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone %s", optionName);
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the engine has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
#endif
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            /*this is getting the x509 private key. In this case, value is a pointer to a const char* that contains the private key as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the x509 private key content");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the private key has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp("TrustedCerts", optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone TrustedCerts");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the certificates have been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, optionName) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_data = (HTTP_PROXY_OPTIONS*)value;

            HTTP_PROXY_OPTIONS* new_proxy_info = malloc(sizeof(HTTP_PROXY_OPTIONS));
            if (new_proxy_info == NULL)
            {
                LogError("unable to allocate proxy option information");
                result = HTTPAPI_ERROR;
            }
            else
            {
                new_proxy_info->host_address = proxy_data->host_address;
                new_proxy_info->port = proxy_data->port;
                new_proxy_info->password = proxy_data->password;
                new_proxy_info->username = proxy_data->username;
                *savedValue = new_proxy_info;
                result = HTTPAPI_OK;
            }
        }
        /*all "long" options are cloned in the same way*/
        else if (
            (strcmp(OPTION_CURL_LOW_SPEED_LIMIT, optionName) == 0) ||
            (strcmp(OPTION_CURL_LOW_SPEED_TIME, optionName) == 0) ||
            (strcmp(OPTION_CURL_FRESH_CONNECT, optionName) == 0) ||
            (strcmp(OPTION_CURL_FORBID_REUSE, optionName) == 0) ||
            (strcmp(OPTION_CURL_VERBOSE, optionName) == 0)
            )
        {
            /*by convention value is pointing to an long */
            long* temp = malloc(sizeof(long)); /*shall be freed by HTTPAPIEX*/
            if (temp == NULL)
            {
                result = HTTPAPI_ERROR;
                LogError("malloc failed (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                *temp = *(const long*)value;
                *savedValue = temp;
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_CURL_INTERFACE, optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the interface name");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the interface name has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else
        {
            result = HTTPAPI_INVALID_ARG;
            LogError("unknown option %s", optionName);
        }
    }
    return result;
}